

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtriangulator.cpp
# Opt level: O2

bool __thiscall
QTriangulator<unsigned_int>::SimpleToMonotone::edgeIsLeftOfEdge
          (SimpleToMonotone *this,int leftEdgeIndex,int rightEdgeIndex)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  Edge *pEVar4;
  QPodPoint *pQVar5;
  qint64 qVar6;
  
  pEVar4 = (this->m_edges).buffer;
  uVar2 = (&pEVar4[rightEdgeIndex].from)[pEVar4[rightEdgeIndex].pointingUp];
  pQVar5 = (this->m_parent->m_vertices).buffer;
  uVar3 = (&pEVar4[rightEdgeIndex].from)[pEVar4[rightEdgeIndex].pointingUp ^ 1];
  bVar1 = pEVar4[leftEdgeIndex].pointingUp;
  qVar6 = qPointDistanceFromLine
                    (pQVar5 + (int)(&pEVar4[leftEdgeIndex].from)[bVar1],pQVar5 + (int)uVar3,
                     pQVar5 + (int)uVar2);
  if (qVar6 == 0) {
    qVar6 = qPointDistanceFromLine
                      (pQVar5 + (int)(&pEVar4[leftEdgeIndex].from)[bVar1 ^ 1],pQVar5 + (int)uVar3,
                       pQVar5 + (int)uVar2);
  }
  return SUB81((ulong)qVar6 >> 0x3f,0);
}

Assistant:

bool QTriangulator<T>::SimpleToMonotone::edgeIsLeftOfEdge(int leftEdgeIndex, int rightEdgeIndex) const
{
    const Edge &leftEdge = m_edges.at(leftEdgeIndex);
    const Edge &rightEdge = m_edges.at(rightEdgeIndex);
    const QPodPoint &u = m_parent->m_vertices.at(rightEdge.upper());
    const QPodPoint &l = m_parent->m_vertices.at(rightEdge.lower());
    qint64 d = QT_PREPEND_NAMESPACE(qPointDistanceFromLine)(m_parent->m_vertices.at(leftEdge.upper()), l, u);
    // d < 0: left, d > 0: right, d == 0: on top
    if (d == 0)
        d = QT_PREPEND_NAMESPACE(qPointDistanceFromLine)(m_parent->m_vertices.at(leftEdge.lower()), l, u);
    return d < 0;
}